

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::write_significand<char,fmt::v8::appender,unsigned_int>
                   (appender out,uint significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar1;
  appender out_00;
  format_decimal_result<char_*> fVar2;
  char buffer_1 [10];
  char buffer [10];
  char local_242 [10];
  undefined **local_238;
  char *local_230;
  size_t sStack_228;
  ulong local_220;
  char local_218 [504];
  
  if ((grouping->sep_).thousands_sep == '\0') {
    fVar2 = format_decimal<char,unsigned_int>((char *)&local_238,significand,significand_size);
    out_00 = copy_str_noinline<char,char*,fmt::v8::appender>((char *)&local_238,fVar2.end,out);
    local_238 = (undefined **)CONCAT71(local_238._1_7_,0x30);
    bVar1.container =
         (buffer<char> *)fill_n<fmt::v8::appender,int,char>(out_00,exponent,(char *)&local_238);
  }
  else {
    sStack_228 = 0;
    local_238 = &PTR_grow_001ecf68;
    local_220 = 500;
    local_230 = local_218;
    fVar2 = format_decimal<char,unsigned_int>(local_242,significand,significand_size);
    copy_str_noinline<char,char*,fmt::v8::appender>(local_242,fVar2.end,(appender)&local_238);
    local_242[0] = '0';
    fill_n<fmt::v8::appender,int,char>((appender)&local_238,exponent,local_242);
    digits.size_ = sStack_228;
    digits.data_ = local_230;
    bVar1.container =
         (buffer<char> *)digit_grouping<char>::apply<fmt::v8::appender,char>(grouping,out,digits);
    if (local_230 != local_218) {
      operator_delete(local_230,local_220);
    }
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar1.container;
}

Assistant:

inline auto write_significand(OutputIt out, T significand, int significand_size,
                              int exponent,
                              const digit_grouping<Char>& grouping)
    -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}